

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

void __thiscall chaiscript::exception::eval_error::eval_error(eval_error *this,eval_error *param_1)

{
  pointer pcVar1;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,&param_1->super_runtime_error);
  *(undefined ***)this = &PTR__eval_error_003fa1e0;
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  pcVar1 = (param_1->reason)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->reason,pcVar1,pcVar1 + (param_1->reason)._M_string_length);
  this->start_position = param_1->start_position;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (param_1->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar1,pcVar1 + (param_1->filename)._M_string_length);
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  pcVar1 = (param_1->detail)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->detail,pcVar1,pcVar1 + (param_1->detail)._M_string_length);
  std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::vector
            (&this->call_stack,&param_1->call_stack);
  return;
}

Assistant:

eval_error(const eval_error &) = default;